

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzmatredstructmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZFMatrix<double>,_double,_TPZStructMatrixOR<double>_>
::TPZMatRedStructMatrix
          (TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZFMatrix<double>,_double,_TPZStructMatrixOR<double>_>
           *this)

{
  *(undefined8 *)&this->field_0xb0 = 0x1a0f120;
  *(undefined8 *)this = 0x1a0f1e8;
  *(undefined4 *)&this->field_0xb8 = 0;
  this->field_0xbc = 1;
  memset(this,0,0xa0);
  TPZStructMatrix::TPZStructMatrix((TPZStructMatrix *)this,&PTR_construction_vtable_104__01a0e1e8);
  *(undefined8 *)this = 0x1a0eb18;
  *(undefined8 *)&this->field_0xb0 = 0x1a0ebf8;
  TPZStructMatrixOR<double>::TPZStructMatrixOR
            ((TPZStructMatrixOR<double> *)&this->field_0xa0,&PTR_construction_vtable_104__01a0e210);
  *(undefined8 *)this = 0x1a0dfa8;
  *(undefined8 *)&this->field_0xb0 = 0x1a0e168;
  *(undefined8 *)&this->field_0xa0 = 0x1a0e068;
  return;
}

Assistant:

TPZMatRedStructMatrix<TStructMatrix,TSparseMatrix,TVar,TPar>::TPZMatRedStructMatrix() : TPZStructMatrixT<TVar>()
{
}